

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t
psa_aead_setup(aead_operation_t *operation,psa_key_handle_t handle,psa_key_usage_t usage,
              psa_algorithm_t alg)

{
  ushort uVar1;
  psa_status_t pVar2;
  int ret;
  undefined8 in_RAX;
  mbedtls_cipher_info_t *pmVar3;
  uint uVar4;
  mbedtls_cipher_id_t cipher_id;
  mbedtls_cipher_id_t local_24;
  
  local_24 = (mbedtls_cipher_id_t)((ulong)in_RAX >> 0x20);
  pVar2 = psa_get_key_from_slot(handle,&operation->slot,usage,alg);
  if (pVar2 == 0) {
    uVar1 = (operation->slot->attr).bits;
    pmVar3 = mbedtls_cipher_info_from_psa(alg,(operation->slot->attr).type,(ulong)uVar1,&local_24);
    operation->cipher_info = pmVar3;
    pVar2 = -0x86;
    if (pmVar3 != (mbedtls_cipher_info_t *)0x0) {
      uVar4 = alg & 0xffffc0ff;
      if (uVar4 == 0x6000005) {
        operation->core_alg = 0x6001005;
        operation->full_tag_length = '\x10';
        if (alg != 0x6001005) {
          return -0x86;
        }
        mbedtls_chachapoly_init(&(operation->ctx).chachapoly);
        ret = mbedtls_chachapoly_setkey
                        (&(operation->ctx).chachapoly,(operation->slot->data).raw.data);
      }
      else if (uVar4 == 0x6400002) {
        operation->core_alg = 0x6401002;
        operation->full_tag_length = '\x10';
        if (((operation->slot->attr).type & 0x7700) != 0x2400) {
          return -0x87;
        }
        mbedtls_gcm_init(&(operation->ctx).gcm);
        ret = mbedtls_gcm_setkey(&(operation->ctx).gcm,local_24,(operation->slot->data).raw.data,
                                 (uint)uVar1);
      }
      else {
        if (uVar4 != 0x6400001) {
          return -0x86;
        }
        operation->core_alg = 0x6401001;
        operation->full_tag_length = '\x10';
        if (((operation->slot->attr).type & 0x7700) != 0x2400) {
          return -0x87;
        }
        mbedtls_ccm_init(&(operation->ctx).ccm);
        ret = mbedtls_ccm_setkey(&(operation->ctx).ccm,local_24,(operation->slot->data).raw.data,
                                 (uint)uVar1);
      }
      pVar2 = mbedtls_to_psa_error(ret);
      if (pVar2 == 0) {
        uVar4 = alg >> 8 & 0x3f;
        if ((alg & 0x7f000000) != 0x6000000) {
          uVar4 = 0;
        }
        pVar2 = -0x87;
        if (uVar4 <= operation->full_tag_length) {
          operation->tag_length = (uint8_t)uVar4;
          return 0;
        }
      }
      psa_aead_abort_internal(operation);
    }
  }
  return pVar2;
}

Assistant:

static psa_status_t psa_aead_setup( aead_operation_t *operation,
                                    psa_key_handle_t handle,
                                    psa_key_usage_t usage,
                                    psa_algorithm_t alg )
{
    psa_status_t status;
    size_t key_bits;
    mbedtls_cipher_id_t cipher_id;

    status = psa_get_transparent_key( handle, &operation->slot, usage, alg );
    if( status != PSA_SUCCESS )
        return( status );

    key_bits = psa_get_key_slot_bits( operation->slot );

    operation->cipher_info =
        mbedtls_cipher_info_from_psa( alg, operation->slot->attr.type, key_bits,
                                      &cipher_id );
    if( operation->cipher_info == NULL )
        return( PSA_ERROR_NOT_SUPPORTED );

    switch( PSA_ALG_AEAD_WITH_TAG_LENGTH( alg, 0 ) )
    {
#if defined(MBEDTLS_CCM_C)
        case PSA_ALG_AEAD_WITH_TAG_LENGTH( PSA_ALG_CCM, 0 ):
            operation->core_alg = PSA_ALG_CCM;
            operation->full_tag_length = 16;
            /* CCM allows the following tag lengths: 4, 6, 8, 10, 12, 14, 16.
             * The call to mbedtls_ccm_encrypt_and_tag or
             * mbedtls_ccm_auth_decrypt will validate the tag length. */
            if( PSA_BLOCK_CIPHER_BLOCK_SIZE( operation->slot->attr.type ) != 16 )
                return( PSA_ERROR_INVALID_ARGUMENT );
            mbedtls_ccm_init( &operation->ctx.ccm );
            status = mbedtls_to_psa_error(
                mbedtls_ccm_setkey( &operation->ctx.ccm, cipher_id,
                                    operation->slot->data.raw.data,
                                    (unsigned int) key_bits ) );
            if( status != 0 )
                goto cleanup;
            break;
#endif /* MBEDTLS_CCM_C */

#if defined(MBEDTLS_GCM_C)
        case PSA_ALG_AEAD_WITH_TAG_LENGTH( PSA_ALG_GCM, 0 ):
            operation->core_alg = PSA_ALG_GCM;
            operation->full_tag_length = 16;
            /* GCM allows the following tag lengths: 4, 8, 12, 13, 14, 15, 16.
             * The call to mbedtls_gcm_crypt_and_tag or
             * mbedtls_gcm_auth_decrypt will validate the tag length. */
            if( PSA_BLOCK_CIPHER_BLOCK_SIZE( operation->slot->attr.type ) != 16 )
                return( PSA_ERROR_INVALID_ARGUMENT );
            mbedtls_gcm_init( &operation->ctx.gcm );
            status = mbedtls_to_psa_error(
                mbedtls_gcm_setkey( &operation->ctx.gcm, cipher_id,
                                    operation->slot->data.raw.data,
                                    (unsigned int) key_bits ) );
            if( status != 0 )
                goto cleanup;
            break;
#endif /* MBEDTLS_GCM_C */

#if defined(MBEDTLS_CHACHAPOLY_C)
        case PSA_ALG_AEAD_WITH_TAG_LENGTH( PSA_ALG_CHACHA20_POLY1305, 0 ):
            operation->core_alg = PSA_ALG_CHACHA20_POLY1305;
            operation->full_tag_length = 16;
            /* We only support the default tag length. */
            if( alg != PSA_ALG_CHACHA20_POLY1305 )
                return( PSA_ERROR_NOT_SUPPORTED );
            mbedtls_chachapoly_init( &operation->ctx.chachapoly );
            status = mbedtls_to_psa_error(
                mbedtls_chachapoly_setkey( &operation->ctx.chachapoly,
                                           operation->slot->data.raw.data ) );
            if( status != 0 )
                goto cleanup;
            break;
#endif /* MBEDTLS_CHACHAPOLY_C */

        default:
            return( PSA_ERROR_NOT_SUPPORTED );
    }

    if( PSA_AEAD_TAG_LENGTH( alg ) > operation->full_tag_length )
    {
        status = PSA_ERROR_INVALID_ARGUMENT;
        goto cleanup;
    }
    operation->tag_length = PSA_AEAD_TAG_LENGTH( alg );

    return( PSA_SUCCESS );

cleanup:
    psa_aead_abort_internal( operation );
    return( status );
}